

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O2

bool __thiscall
TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
          (TaskQueue<std::shared_ptr<VRleTask>_> *this,shared_ptr<VRleTask> *task)

{
  __shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar1;
  lock_t lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->_mutex;
  local_20._M_owns = std::mutex::try_lock(local_20._M_device);
  if ((local_20._M_owns) &&
     (__r = &((this->_q).
              super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>,
     &((this->_q).
       super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur)->
      super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2> != __r)) {
    std::__shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&task->super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>,__r);
    std::deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>::pop_front
              (&this->_q);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return bVar1;
}

Assistant:

bool try_pop(Task &task)
    {
        lock_t lock{_mutex, std::try_to_lock};
        if (!lock || _q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }